

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form_test.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  undefined8 uVar1;
  service srv;
  service local_50 [8];
  undefined1 local_48 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  function *local_38;
  undefined8 uStack_30;
  code *local_28;
  code *pcStack_20;
  
  cppcms::service::service(local_50,argc,argv);
  uVar1 = cppcms::service::applications_pool();
  cppcms::create_pool<unit_test>();
  cppcms::applications_pool::mount(uVar1,local_48,0);
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  uStack_30 = 0;
  pcStack_20 = std::_Function_handler<void_(),_submitter>::_M_invoke;
  local_28 = std::_Function_handler<void_(),_submitter>::_M_manager;
  local_38 = (function *)local_50;
  cppcms::service::after_fork((function *)local_50);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,3);
  }
  cppcms::service::run();
  cppcms::service::~service(local_50);
  return run_ok ^ 1;
}

Assistant:

int main(int argc,char **argv)
{
	try {
		cppcms::service srv(argc,argv);
		srv.applications_pool().mount( cppcms::create_pool<unit_test>());
		srv.after_fork(submitter(srv));
		srv.run();
	}
	catch(std::exception const &e) {
		std::cerr << e.what() << std::endl;
		return EXIT_FAILURE;
	}
	return run_ok ? EXIT_SUCCESS : EXIT_FAILURE;
}